

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalStructInference.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_226::GlobalStructInference::run(GlobalStructInference *this,Module *module)

{
  Type TVar1;
  Module *wasm;
  bool bVar2;
  PassOptions *pPVar3;
  reference __in;
  type *this_00;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *this_01;
  reference this_02;
  pointer pGVar4;
  reference ppSVar5;
  pointer pGVar6;
  reference pHVar7;
  reference __in_00;
  type *ptVar8;
  type *this_03;
  HeapType *pHVar9;
  size_type sVar10;
  reference pNVar11;
  mapped_type *pmVar12;
  PassRunner *runner;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar13;
  optional<wasm::HeapType> oVar14;
  FunctionOptimizer local_5c0;
  Name *local_4b0;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_4a8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_4a0;
  type *globals_1;
  type *type_5;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  local_488;
  iterator __end2_4;
  iterator __begin2_4;
  unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  *__range2_4;
  undefined1 auStack_468 [8];
  Name global_1;
  iterator __end5;
  iterator __begin5;
  type *__range5;
  optional<wasm::HeapType> super_1;
  HeapType curr;
  type *globals;
  type *type_4;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
  local_410;
  iterator __end2_3;
  iterator __begin2_3;
  unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  *__range2_3;
  unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  typeGlobalsCopy;
  optional<wasm::HeapType> super;
  value_type local_3a0;
  HeapType type_3;
  iterator __end2_2;
  iterator __begin2_2;
  HeapTypes *__range2_2;
  HeapTypes unoptimizableCopy;
  value_type local_328;
  HeapType type_1;
  value_type local_310;
  Type local_308;
  Type type_2;
  StructNew *structNew;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_> *__range3_1;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2_1;
  value_type local_298;
  HeapType type;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  type *types;
  type *func;
  _Self local_260;
  iterator __end2;
  iterator __begin2;
  Map *__range2;
  HeapTypes unoptimizable;
  Func local_208;
  undefined1 local_1e8 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  Fatal local_1a0;
  Module *local_18;
  Module *module_local;
  GlobalStructInference *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  bVar2 = FeatureSet::hasGC(&module->features);
  if (bVar2) {
    pPVar3 = Pass::getPassOptions(&this->super_Pass);
    wasm = local_18;
    if ((pPVar3->closedWorld & 1U) == 0) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,(char (*) [28])"GSI requires --closed-world");
      Fatal::~Fatal(&local_1a0);
    }
    std::
    function<void(wasm::Function*,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>&)>
    ::
    function<wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::_lambda(wasm::Function*,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>&)_1_,void>
              ((function<void(wasm::Function*,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>&)>
                *)&local_208,
               (anon_class_1_0_00000001 *)((long)&unoptimizable._M_h._M_single_bucket + 7));
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_1e8,wasm,&local_208);
    std::
    function<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&)>
    ::~function(&local_208);
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                     *)&__range2);
    __end2 = std::
             map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
             ::begin((map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                      *)&analysis);
    local_260._M_node =
         (_Base_ptr)
         std::
         map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
         ::end((map<wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                *)&analysis);
    while (bVar2 = std::operator!=(&__end2,&local_260), bVar2) {
      __in = std::
             _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>
             ::operator*(&__end2);
      std::
      get<0ul,wasm::Function*const,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>>
                (__in);
      this_00 = std::
                get<1ul,wasm::Function*const,std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>>
                          (__in);
      __end3 = std::
               unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
               ::begin(this_00);
      type.id = (uintptr_t)
                std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::end(this_00);
      while (bVar2 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<wasm::HeapType,_true>,
                                (_Node_iterator_base<wasm::HeapType,_true> *)&type), bVar2) {
        pHVar7 = std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator*(&__end3);
        local_298.id = pHVar7->id;
        std::
        unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
        ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                  *)&__range2,&local_298);
        std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator++(&__end3);
      }
      std::
      _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>
      ::operator++(&__end2);
    }
    this_01 = &local_18->globals;
    __end2_1 = std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::begin(this_01);
    global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
             std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                               *)&global), bVar2) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                ::operator*(&__end2_1);
      pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         (this_02);
      bVar2 = Importable::imported(&pGVar4->super_Importable);
      if (!bVar2) {
        pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (this_02);
        FindAll<wasm::StructNew>::FindAll((FindAll<wasm::StructNew> *)&__begin3_1,pGVar4->init);
        __end3_1 = std::vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>::begin
                             ((vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_> *)
                              &__begin3_1);
        structNew = (StructNew *)
                    std::vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>::end
                              ((vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_> *)
                               &__begin3_1);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<wasm::StructNew_**,_std::vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>_>
                                   *)&structNew), bVar2) {
          ppSVar5 = __gnu_cxx::
                    __normal_iterator<wasm::StructNew_**,_std::vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>_>
                    ::operator*(&__end3_1);
          type_2.id = (uintptr_t)*ppSVar5;
          local_308.id = (((StructNew *)type_2.id)->
                         super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.
                         id;
          bVar2 = wasm::Type::isRef(&local_308);
          TVar1.id = type_2.id;
          if ((bVar2) &&
             (pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                                 (this_02), (Expression *)TVar1.id != pGVar4->init)) {
            local_310.id = (uintptr_t)wasm::Type::getHeapType(&local_308);
            pVar13 = std::
                     unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                     ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                               *)&__range2,&local_310);
            type_1.id = (uintptr_t)
                        pVar13.first.super__Node_iterator_base<wasm::HeapType,_true>._M_cur;
          }
          __gnu_cxx::
          __normal_iterator<wasm::StructNew_**,_std::vector<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>_>
          ::operator++(&__end3_1);
        }
        FindAll<wasm::StructNew>::~FindAll((FindAll<wasm::StructNew> *)&__begin3_1);
        pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (this_02);
        bVar2 = wasm::Type::isRef(&pGVar4->init->type);
        if (bVar2) {
          pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             (this_02);
          local_328.id = (uintptr_t)wasm::Type::getHeapType(&pGVar4->init->type);
          pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             (this_02);
          pGVar6 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             (this_02);
          bVar2 = wasm::Type::operator!=(&pGVar4->type,&pGVar6->init->type);
          if (bVar2) {
            std::
            unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
            ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                      *)&__range2,&local_328);
          }
          else {
            pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                               (this_02);
            if ((pGVar4->mutable_ & 1U) == 0) {
              pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                                 (this_02);
              bVar2 = Expression::is<wasm::StructNew>(pGVar4->init);
              if (bVar2) {
                pmVar12 = std::
                          unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                          ::operator[](&this->typeGlobals,&local_328);
                pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::
                         operator->(this_02);
                std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                          (pmVar12,(value_type *)pGVar4);
              }
            }
            else {
              pVar13 = std::
                       unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                       ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                                 *)&__range2,&local_328);
              unoptimizableCopy._M_h._M_single_bucket =
                   (__node_base_ptr)
                   pVar13.first.super__Node_iterator_base<wasm::HeapType,_true>._M_cur;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                     *)&__range2_2,
                    (unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                     *)&__range2);
    __end2_2 = std::
               unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
               ::begin((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *)&__range2_2);
    type_3.id = (uintptr_t)
                std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::end((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                       *)&__range2_2);
    while (bVar2 = std::__detail::operator!=
                             (&__end2_2.super__Node_iterator_base<wasm::HeapType,_true>,
                              (_Node_iterator_base<wasm::HeapType,_true> *)&type_3), bVar2) {
      pHVar7 = std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator*(&__end2_2);
      local_3a0.id = pHVar7->id;
      while( true ) {
        std::
        unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
        ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                  *)&__range2,&local_3a0);
        std::
        unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
        ::erase(&this->typeGlobals,&local_3a0);
        oVar14 = HeapType::getSuperType(&local_3a0);
        typeGlobalsCopy._M_h._M_single_bucket =
             oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional *)&typeGlobalsCopy._M_h._M_single_bucket);
        if (!bVar2) break;
        pHVar9 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&typeGlobalsCopy._M_h._M_single_bucket);
        local_3a0.id = pHVar9->id;
      }
      std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator++(&__end2_2);
    }
    std::
    unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
    ::unordered_map((unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                     *)&__range2_3,&this->typeGlobals);
    __end2_3 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               ::begin((unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                        *)&__range2_3);
    local_410._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
         ::end((unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                *)&__range2_3);
    while (bVar2 = std::__detail::operator!=
                             (&__end2_3.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                              ,&local_410), bVar2) {
      __in_00 = std::__detail::
                _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
                ::operator*(&__end2_3);
      ptVar8 = std::get<0ul,wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                         (__in_00);
      this_03 = std::
                get<1ul,wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                          (__in_00);
      super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = ptVar8->id;
      while( true ) {
        oVar14 = HeapType::getSuperType
                           ((HeapType *)
                            &super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_engaged);
        __range5 = oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload;
        super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
             oVar14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
        bVar2 = std::optional::operator_cast_to_bool((optional *)&__range5);
        if (!bVar2) break;
        pHVar9 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&__range5);
        super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar9->id;
        sVar10 = std::
                 unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                 ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                          *)&__range2,
                         (key_type *)
                         &super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_engaged);
        if (sVar10 == 0) {
          __end5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(this_03);
          global_1.super_IString.str._M_str =
               (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(this_03);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                             *)&global_1.super_IString.str._M_str), bVar2) {
            pNVar11 = __gnu_cxx::
                      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                      ::operator*(&__end5);
            auStack_468 = (undefined1  [8])(pNVar11->super_IString).str._M_len;
            global_1.super_IString.str._M_len = (size_t)(pNVar11->super_IString).str._M_str;
            pmVar12 = std::
                      unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                      ::operator[](&this->typeGlobals,
                                   (key_type *)
                                   &super_1.super__Optional_base<wasm::HeapType,_true,_true>.
                                    _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                    _M_engaged);
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                      (pmVar12,(value_type *)auStack_468);
            __gnu_cxx::
            __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
            operator++(&__end5);
          }
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
      ::operator++(&__end2_3);
    }
    bVar2 = std::
            unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
            ::empty(&this->typeGlobals);
    if (!bVar2) {
      __end2_4 = std::
                 unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                 ::begin(&this->typeGlobals);
      local_488._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
           ::end(&this->typeGlobals);
      while (bVar2 = std::__detail::operator!=
                               (&__end2_4.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                                ,&local_488), bVar2) {
        type_5 = &std::__detail::
                  _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
                  ::operator*(&__end2_4)->first;
        globals_1 = (type *)std::
                            get<0ul,wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                                      ((pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                        *)type_5);
        local_4a0 = std::
                    get<1ul,wasm::HeapType_const,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                              ((pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                *)type_5);
        local_4a8._M_current =
             (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(local_4a0);
        local_4b0 = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(local_4a0);
        std::
        sort<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>>
                  (local_4a8,
                   (__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                    )local_4b0);
        std::__detail::
        _Node_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_false,_true>
        ::operator++(&__end2_4);
      }
      wasm::(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::FunctionOptimizer::
      FunctionOptimizer(wasm::(anonymous)::GlobalStructInference__(&local_5c0,this);
      runner = Pass::getPassRunner(&this->super_Pass);
      WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>::run
                (&local_5c0.
                  super_WalkerPass<wasm::PostWalker<FunctionOptimizer,_wasm::Visitor<FunctionOptimizer,_void>_>_>
                 ,runner,local_18);
      run::FunctionOptimizer::~FunctionOptimizer(&local_5c0);
    }
    std::
    unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
    ::~unordered_map((unordered_map<wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
                      *)&__range2_3);
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                      *)&__range2_2);
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                      *)&__range2);
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::~ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_1e8);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "GSI requires --closed-world";
    }

    // First, find all the information we need. We need to know which struct
    // types are created in functions, because we will not be able to optimize
    // those.

    using HeapTypes = std::unordered_set<HeapType>;

    ModuleUtils::ParallelFunctionAnalysis<HeapTypes> analysis(
      *module, [&](Function* func, HeapTypes& types) {
        if (func->imported()) {
          return;
        }

        for (auto* structNew : FindAll<StructNew>(func->body).list) {
          auto type = structNew->type;
          if (type.isRef()) {
            types.insert(type.getHeapType());
          }
        }
      });

    // We cannot optimize types that appear in a struct.new in a function, which
    // we just collected and merge now.
    HeapTypes unoptimizable;

    for (auto& [func, types] : analysis.map) {
      for (auto type : types) {
        unoptimizable.insert(type);
      }
    }

    // Process the globals.
    for (auto& global : module->globals) {
      if (global->imported()) {
        continue;
      }

      // We cannot optimize a type that appears in a non-toplevel location in a
      // global init.
      for (auto* structNew : FindAll<StructNew>(global->init).list) {
        auto type = structNew->type;
        if (type.isRef() && structNew != global->init) {
          unoptimizable.insert(type.getHeapType());
        }
      }

      if (!global->init->type.isRef()) {
        continue;
      }

      auto type = global->init->type.getHeapType();

      // The global's declared type must match the init's type. If not, say if
      // we had a global declared as type |any| but that contains (ref $A), then
      // that is not something we can optimize, as ref.eq on a global.get of
      // that global will not validate. (This should not be a problem after
      // GlobalSubtyping runs, which will specialize the type of the global.)
      if (global->type != global->init->type) {
        unoptimizable.insert(type);
        continue;
      }

      // We cannot optimize mutable globals.
      if (global->mutable_) {
        unoptimizable.insert(type);
        continue;
      }

      // Finally, if this is a struct.new then it is one we can optimize; note
      // it.
      if (global->init->is<StructNew>()) {
        typeGlobals[type].push_back(global->name);
      }
    }

    // A struct.get might also read from any of the subtypes. As a result, an
    // unoptimizable type makes all its supertypes unoptimizable as well.
    // TODO: this could be specific per field (and not all supers have all
    //       fields)
    // Iterate on a copy to avoid invalidation as we insert.
    auto unoptimizableCopy = unoptimizable;
    for (auto type : unoptimizableCopy) {
      while (1) {
        unoptimizable.insert(type);

        // Also erase the globals, as we will never read them anyhow. This can
        // allow us to skip unneeded work, when we check if typeGlobals is
        // empty, below.
        typeGlobals.erase(type);

        auto super = type.getSuperType();
        if (!super) {
          break;
        }
        type = *super;
      }
    }

    // Similarly, propagate global names: if one type has [global1], then a get
    // of any supertype might access that, so propagate to them.
    auto typeGlobalsCopy = typeGlobals;
    for (auto& [type, globals] : typeGlobalsCopy) {
      auto curr = type;
      while (1) {
        auto super = curr.getSuperType();
        if (!super) {
          break;
        }
        curr = *super;

        // As above, avoid adding pointless data for anything unoptimizable.
        if (!unoptimizable.count(curr)) {
          for (auto global : globals) {
            typeGlobals[curr].push_back(global);
          }
        }
      }
    }

    if (typeGlobals.empty()) {
      // We found nothing we can optimize.
      return;
    }

    // The above loop on typeGlobalsCopy is on an unsorted data structure, and
    // that can lead to nondeterminism in typeGlobals. Sort the vectors there to
    // ensure determinism.
    for (auto& [type, globals] : typeGlobals) {
      std::sort(globals.begin(), globals.end());
    }

    // Optimize based on the above.
    struct FunctionOptimizer
      : public WalkerPass<PostWalker<FunctionOptimizer>> {
      bool isFunctionParallel() override { return true; }

      std::unique_ptr<Pass> create() override {
        return std::make_unique<FunctionOptimizer>(parent);
      }

      FunctionOptimizer(GlobalStructInference& parent) : parent(parent) {}

      void visitStructGet(StructGet* curr) {
        auto type = curr->ref->type;
        if (type == Type::unreachable) {
          return;
        }

        // We must ignore the case of a non-struct heap type, that is, a bottom
        // type (which is all that is left after we've already ruled out
        // unreachable). Such things will not be in typeGlobals, which we are
        // checking now anyhow.
        auto heapType = type.getHeapType();
        auto iter = parent.typeGlobals.find(heapType);
        if (iter == parent.typeGlobals.end()) {
          return;
        }

        // This cannot be a bottom type as we found it in the typeGlobals map,
        // which only contains types of struct.news.
        assert(heapType.isStruct());

        // The field must be immutable.
        auto fieldIndex = curr->index;
        auto& field = heapType.getStruct().fields[fieldIndex];
        if (field.mutable_ == Mutable) {
          return;
        }

        const auto& globals = iter->second;
        if (globals.size() == 0) {
          return;
        }

        auto& wasm = *getModule();
        Builder builder(wasm);

        if (globals.size() == 1) {
          // Leave it to other passes to infer the constant value of the field,
          // if there is one: just change the reference to the global, which
          // will unlock those other optimizations. Note we must trap if the ref
          // is null, so add RefAsNonNull here.
          auto global = globals[0];
          curr->ref = builder.makeSequence(
            builder.makeDrop(builder.makeRefAs(RefAsNonNull, curr->ref)),
            builder.makeGlobalGet(global, wasm.getGlobal(globals[0])->type));
          return;
        }

        // We are looking for the case where we can pick between two values
        // using a single comparison. More than two values, or more than a
        // single comparison, add tradeoffs that may not be worth it, and a
        // single value (or no value) is already handled by other passes.
        //
        // That situation may involve more than two globals. For example we may
        // have three relevant globals, but two may have the same value. In that
        // case we can compare against the third:
        //
        //  $global0: (struct.new $Type (i32.const 42))
        //  $global1: (struct.new $Type (i32.const 42))
        //  $global2: (struct.new $Type (i32.const 1337))
        //
        // (struct.get $Type (ref))
        //   =>
        // (select
        //   (i32.const 1337)
        //   (i32.const 42)
        //   (ref.eq (ref) $global2))

        // Find the constant values and which globals correspond to them.
        // TODO: SmallVectors?
        std::vector<Literal> values;
        std::vector<std::vector<Name>> globalsForValue;

        // Check if the relevant fields contain constants.
        auto fieldType = field.type;
        for (Index i = 0; i < globals.size(); i++) {
          Name global = globals[i];
          auto* structNew = wasm.getGlobal(global)->init->cast<StructNew>();
          Literal value;
          if (structNew->isWithDefault()) {
            value = Literal::makeZero(fieldType);
          } else {
            auto* init = structNew->operands[fieldIndex];
            if (!Properties::isConstantExpression(init)) {
              // Non-constant; give up entirely.
              return;
            }
            value = Properties::getLiteral(init);
          }

          // Process the current value, comparing it against the previous.
          auto found = std::find(values.begin(), values.end(), value);
          if (found == values.end()) {
            // This is a new value.
            assert(values.size() <= 2);
            if (values.size() == 2) {
              // Adding this value would mean we have too many, so give up.
              return;
            }
            values.push_back(value);
            globalsForValue.push_back({global});
          } else {
            // This is an existing value.
            Index index = found - values.begin();
            globalsForValue[index].push_back(global);
          }
        }

        // We have some globals (at least 2), and so must have at least one
        // value. And we have already exited if we have more than 2 values (see
        // the early return above) so that only leaves 1 and 2.
        if (values.size() == 1) {
          // The case of 1 value is simple: trap if the ref is null, and
          // otherwise return the value.
          replaceCurrent(builder.makeSequence(
            builder.makeDrop(builder.makeRefAs(RefAsNonNull, curr->ref)),
            builder.makeConstantExpression(values[0])));
          return;
        }
        assert(values.size() == 2);

        // We have two values. Check that we can pick between them using a
        // single comparison. While doing so, ensure that the index we can check
        // on is 0, that is, the first value has a single global.
        if (globalsForValue[0].size() == 1) {
          // The checked global is already in index 0.
        } else if (globalsForValue[1].size() == 1) {
          std::swap(values[0], values[1]);
          std::swap(globalsForValue[0], globalsForValue[1]);
        } else {
          // Both indexes have more than one option, so we'd need more than one
          // comparison. Give up.
          return;
        }

        // Excellent, we can optimize here! Emit a select.
        //
        // Note that we must trap on null, so add a ref.as_non_null here.
        auto checkGlobal = globalsForValue[0][0];
        replaceCurrent(builder.makeSelect(
          builder.makeRefEq(builder.makeRefAs(RefAsNonNull, curr->ref),
                            builder.makeGlobalGet(
                              checkGlobal, wasm.getGlobal(checkGlobal)->type)),
          builder.makeConstantExpression(values[0]),
          builder.makeConstantExpression(values[1])));
      }

    private:
      GlobalStructInference& parent;
    };

    FunctionOptimizer(*this).run(getPassRunner(), module);
  }